

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_bms.cpp
# Opt level: O0

double __thiscall BmsBms::GetEndTime(BmsBms *this)

{
  bool bVar1;
  pointer ppVar2;
  double *pdVar3;
  double local_38;
  barindex local_2c;
  Iterator IStack_28;
  barindex lastbar;
  _Self local_20;
  Iterator it;
  double t;
  BmsBms *this_local;
  
  it._M_node = (_Base_ptr)0x0;
  local_20._M_node = (_Base_ptr)BmsTimeManager::Begin(&this->time_manager_);
  while( true ) {
    IStack_28 = BmsTimeManager::End(&this->time_manager_);
    bVar1 = std::operator!=(&local_20,&stack0xffffffffffffffd8);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_BmsTime>_>::operator->(&local_20);
    pdVar3 = std::max<double>((double *)&it,&(ppVar2->second).time);
    it._M_node = (_Base_ptr)*pdVar3;
    std::_Rb_tree_iterator<std::pair<const_int,_BmsTime>_>::operator++(&local_20);
  }
  local_2c = GetObjectExistsMaxBar(this);
  local_38 = BmsTimeManager::GetTimeFromBar(&this->time_manager_,(double)local_2c);
  pdVar3 = std::max<double>((double *)&it,&local_38);
  return *pdVar3;
}

Assistant:

double BmsBms::GetEndTime() {
	double t = 0;
	for (auto it = time_manager_.Begin(); it != time_manager_.End(); ++it) {
		t = std::max(t, it->second.time);
	}
	barindex lastbar = GetObjectExistsMaxBar();
	return std::max(t, time_manager_.GetTimeFromBar(lastbar));
}